

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTable.cpp
# Opt level: O2

void __thiscall ItemTable::GreenRoomFour(ItemTable *this)

{
  ItemWrapper *this_00;
  mapped_type *ppIVar1;
  key_type local_5c;
  string local_58;
  Item local_38;
  
  this_00 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_58,"Kid",(allocator *)&local_5c);
  Item::Item(&local_38,&local_58,KID);
  ItemWrapper::ItemWrapper(this_00,&local_38,G_ROOM4_KID);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  local_5c = KID;
  ppIVar1 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_5c);
  *ppIVar1 = this_00;
  return;
}

Assistant:

void ItemTable::GreenRoomFour() {
    ItemWrapper * Kid = new ItemWrapper(Item("Kid", KID), G_ROOM4_KID);

    items[KID] = Kid;

}